

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

char * __thiscall
google::protobuf::compiler::Version::_InternalParse(Version *this,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  uint32_t uVar2;
  string *s;
  ulong tag_00;
  UnknownFieldSet *unknown;
  string *str;
  uint32_t tag;
  HasBits has_bits;
  ParseContext *ctx_local;
  char *ptr_local;
  Version *this_local;
  
  _tag = ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)this;
  internal::HasBits<1UL>::HasBits((HasBits<1UL> *)((long)&str + 4));
  do {
    bVar1 = internal::ParseContext::Done(_tag,(char **)&ctx_local);
    if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_004d6f30;
    ctx_local = (ParseContext *)internal::ReadTag((char *)ctx_local,(uint32_t *)&str,0);
    switch((uint)str >> 3) {
    case 1:
      if (((uint)str & 0xff) != 8) break;
      _Internal::set_has_major((HasBits *)((long)&str + 4));
      uVar2 = internal::ReadVarint32((char **)&ctx_local);
      this->major_ = uVar2;
      goto joined_r0x004d6e04;
    case 2:
      if (((uint)str & 0xff) == 0x10) {
        _Internal::set_has_minor((HasBits *)((long)&str + 4));
        uVar2 = internal::ReadVarint32((char **)&ctx_local);
        this->minor_ = uVar2;
        goto joined_r0x004d6e04;
      }
      break;
    case 3:
      if (((uint)str & 0xff) == 0x18) {
        _Internal::set_has_patch((HasBits *)((long)&str + 4));
        uVar2 = internal::ReadVarint32((char **)&ctx_local);
        this->patch_ = uVar2;
        goto joined_r0x004d6e04;
      }
      break;
    case 4:
      if (((uint)str & 0xff) == 0x22) {
        s = _internal_mutable_suffix_abi_cxx11_(this);
        ctx_local = (ParseContext *)internal::InlineGreedyStringParser(s,(char *)ctx_local,_tag);
        internal::VerifyUTF8(s,"google.protobuf.compiler.Version.suffix");
        goto joined_r0x004d6e04;
      }
    }
    if (((uint)str == 0) || (((uint)str & 7) == 4)) {
      if (ctx_local != (ParseContext *)0x0) {
        internal::EpsCopyInputStream::SetLastTag(&_tag->super_EpsCopyInputStream,(uint)str);
        goto LAB_004d6f30;
      }
      goto LAB_004d6f4b;
    }
    tag_00 = (ulong)(uint)str;
    unknown = internal::InternalMetadata::mutable_unknown_fields<google::protobuf::UnknownFieldSet>
                        (&(this->super_Message).super_MessageLite._internal_metadata_);
    ctx_local = (ParseContext *)internal::UnknownFieldParse(tag_00,unknown,(char *)ctx_local,_tag);
joined_r0x004d6e04:
    if (ctx_local == (ParseContext *)0x0) {
LAB_004d6f4b:
      ctx_local = (ParseContext *)0x0;
LAB_004d6f30:
      internal::HasBits<1UL>::Or(&this->_has_bits_,(HasBits<1UL> *)((long)&str + 4));
      return (char *)ctx_local;
    }
  } while( true );
}

Assistant:

const char* Version::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // optional int32 major = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 8)) {
          _Internal::set_has_major(&has_bits);
          major_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // optional int32 minor = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 16)) {
          _Internal::set_has_minor(&has_bits);
          minor_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // optional int32 patch = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 24)) {
          _Internal::set_has_patch(&has_bits);
          patch_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // optional string suffix = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 34)) {
          auto str = _internal_mutable_suffix();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          #ifndef NDEBUG
          ::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.compiler.Version.suffix");
          #endif  // !NDEBUG
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}